

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayObjectTests.cpp
# Opt level: O3

ShaderProgram * __thiscall
deqp::gles3::Functional::MultiVertexArrayObjectTest::createProgram
          (MultiVertexArrayObjectTest *this,VertexArrayState *state)

{
  RenderContext *renderCtx;
  uint uVar1;
  pointer pAVar2;
  ostream *poVar3;
  ShaderProgram *this_00;
  bool *pbVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  ProgramSources sources;
  stringstream value;
  stringstream vertexShaderStream;
  double local_460;
  value_type local_450;
  value_type local_430;
  undefined1 local_410 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3f8 [5];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_380;
  undefined1 local_360 [32];
  stringstream local_340 [16];
  undefined1 local_330 [376];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__cxx11::stringstream::stringstream(local_340);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"#version 300 es\n",0x10);
  pAVar2 = (state->attributes).
           super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(state->attributes).
                              super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2) >> 2) *
          0x38e38e39) {
    lVar5 = 0x10;
    lVar7 = 0;
    do {
      iVar6 = (int)lVar7;
      if ((&pAVar2->enabled)[lVar5] == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"layout(location = ",0x12);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,") in mediump vec4 a_attrib",0x1a)
        ;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"layout(location = ",0x12);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,") in mediump ivec4 a_attrib",0x1b);
      }
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,";\n",2);
      pAVar2 = (state->attributes).
               super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((&pAVar2->enabled)[lVar5] == '\0') {
        if ((*(int *)((long)pAVar2 + lVar5 + -4) == 0x1406) ||
           (*(char *)((long)&pAVar2->type + lVar5) != '\0')) {
          pbVar4 = (bool *)0x1be7f65;
          if (lVar7 == 0) {
            pbVar4 = ::glcts::fixed_sample_locations_values + 1;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_330,pbVar4,(ulong)(lVar7 != 0) * 3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"a_attrib",8);
          std::ostream::operator<<((ostream *)local_330,iVar6);
        }
        else {
          uVar1 = pAVar2->type - 0x1400;
          uVar8 = 0;
          uVar9 = 0;
          if (uVar1 < 6) {
            uVar8 = (undefined4)*(undefined8 *)(&DAT_01bffa98 + (ulong)uVar1 * 8);
            uVar9 = (undefined4)((ulong)*(undefined8 *)(&DAT_01bffa98 + (ulong)uVar1 * 8) >> 0x20);
          }
          pbVar4 = (bool *)0x1be7f65;
          if (lVar7 == 0) {
            pbVar4 = ::glcts::fixed_sample_locations_values + 1;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_330,pbVar4,(ulong)(lVar7 != 0) * 3);
          poVar3 = std::ostream::_M_insert<double>((double)CONCAT44(uVar9,uVar8));
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," * a_attrib",0xb);
          std::ostream::operator<<(poVar3,iVar6);
        }
      }
      else {
        uVar1 = pAVar2->type - 0x1400;
        uVar8 = 0;
        uVar9 = 0;
        if (uVar1 < 6) {
          uVar8 = (undefined4)*(undefined8 *)(&DAT_01bffac8 + (ulong)uVar1 * 8);
          uVar9 = (undefined4)((ulong)*(undefined8 *)(&DAT_01bffac8 + (ulong)uVar1 * 8) >> 0x20);
        }
        pbVar4 = (bool *)0x1be7f65;
        if (lVar7 == 0) {
          pbVar4 = ::glcts::fixed_sample_locations_values + 1;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_330,pbVar4,(ulong)(lVar7 != 0) * 3);
        poVar3 = std::ostream::_M_insert<double>((double)CONCAT44(uVar9,uVar8));
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," * vec4(a_attrib",0x10);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
      }
      lVar7 = lVar7 + 1;
      pAVar2 = (state->attributes).
               super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x24;
    } while (lVar7 < (int)((ulong)((long)(state->attributes).
                                         super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2)
                          >> 2) * 0x38e38e39);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"out mediump vec4 v_value;\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\tv_value = ",0xb);
  std::__cxx11::stringbuf::str();
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)local_410._0_8_,local_410._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,";\n",2);
  if ((pointer)local_410._0_8_ != (pointer)(local_410 + 0x10)) {
    operator_delete((void *)local_410._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_410._16_8_)->_M_p + 1));
  }
  pAVar2 = (state->attributes).
           super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pAVar2->integer != '\0') {
    uVar1 = pAVar2->type - 0x1400;
    local_460 = 0.0;
    if (uVar1 < 6) {
      local_460 = *(double *)(&DAT_01bffac8 + (ulong)uVar1 * 8);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tgl_Position = vec4(",0x14);
    poVar3 = std::ostream::_M_insert<double>(local_460);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," * ",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"a_attrib0.xyz, 1.0);\n",0x15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}",1);
    goto LAB_01191a79;
  }
  if (pAVar2->normalized == '\0') {
    switch(pAVar2->type) {
    case 0x1400:
      uVar8 = 0x20000000;
      uVar9 = 0x3f804104;
      break;
    case 0x1401:
      uVar8 = 0x80000000;
      uVar9 = 0x3f702040;
      break;
    case 0x1402:
      uVar8 = 0;
      uVar9 = 0x3f000040;
      break;
    case 0x1403:
      uVar8 = 0;
      uVar9 = 0x3ef00020;
      break;
    case 0x1404:
      uVar8 = 0;
      uVar9 = 0x3e000000;
      break;
    case 0x1405:
      uVar8 = 0;
      uVar9 = 0x3df00000;
      break;
    case 0x1406:
      goto switchD_011919d1_caseD_1406;
    default:
      uVar8 = 0;
      uVar9 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tgl_Position = vec4(",0x14);
    poVar3 = std::ostream::_M_insert<double>((double)CONCAT44(uVar9,uVar8));
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," * ",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"vec3(a_attrib0.xyz), 1.0);\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}",1);
  }
  else {
switchD_011919d1_caseD_1406:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tgl_Position = vec4(a_attrib0.xyz, 1.0);\n",0x29);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}",1);
  }
LAB_01191a79:
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  std::__cxx11::stringbuf::str();
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_450,
             "#version 300 es\nin mediump vec4 v_value;\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = vec4(v_value.xyz, 1.0);\n}"
             ,"");
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_410,0,0xac);
  local_360._0_8_ = (pointer)0x0;
  local_360[8] = 0;
  local_360._9_7_ = 0;
  local_360[0x10] = 0;
  local_360._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_410,&local_430);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_3f8,&local_450);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,(ProgramSources *)local_410);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_360);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_380);
  lVar5 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_410 + lVar5));
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base((ios_base *)(local_330 + 0x70));
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return this_00;
}

Assistant:

glu::ShaderProgram* MultiVertexArrayObjectTest::createProgram (const VertexArrayState& state)
{
	std::stringstream vertexShaderStream;
	std::stringstream value;

	vertexShaderStream << "#version 300 es\n";

	for (int attribNdx = 0; attribNdx < (int)state.attributes.size(); attribNdx++)
	{
		if (state.attributes[attribNdx].integer)
			vertexShaderStream << "layout(location = " << attribNdx << ") in mediump ivec4 a_attrib" << attribNdx << ";\n";
		else
			vertexShaderStream << "layout(location = " << attribNdx << ") in mediump vec4 a_attrib" << attribNdx << ";\n";

		if (state.attributes[attribNdx].integer)
		{
			float scale = 0.0f;

			switch (state.attributes[0].type)
			{
				case GL_SHORT:			scale  = (1.0f/float((1u<<14)-1u));	break;
				case GL_UNSIGNED_SHORT:	scale  = (1.0f/float((1u<<15)-1u));	break;
				case GL_INT:			scale  = (1.0f/float((1u<<30)-1u));	break;
				case GL_UNSIGNED_INT:	scale  = (1.0f/float((1u<<31)-1u));	break;
				case GL_BYTE:			scale  = (1.0f/float((1u<<6)-1u));	break;
				case GL_UNSIGNED_BYTE:	scale  = (1.0f/float((1u<<7)-1u));	break;

				default:
					DE_ASSERT(DE_FALSE);
			}
			value << (attribNdx != 0 ? " + " : "" ) << scale << " * vec4(a_attrib" << attribNdx << ")";
		}
		else if (state.attributes[attribNdx].type != GL_FLOAT && !state.attributes[attribNdx].normalized)
		{
			float scale = 0.0f;

			switch (state.attributes[0].type)
			{
				case GL_SHORT:			scale  = (0.5f/float((1u<<14)-1u));	break;
				case GL_UNSIGNED_SHORT:	scale  = (0.5f/float((1u<<15)-1u));	break;
				case GL_INT:			scale  = (0.5f/float((1u<<30)-1u));	break;
				case GL_UNSIGNED_INT:	scale  = (0.5f/float((1u<<31)-1u));	break;
				case GL_BYTE:			scale  = (0.5f/float((1u<<6)-1u));	break;
				case GL_UNSIGNED_BYTE:	scale  = (0.5f/float((1u<<7)-1u));	break;

				default:
					DE_ASSERT(DE_FALSE);
			}
			value << (attribNdx != 0 ? " + " : "" ) << scale << " * a_attrib" << attribNdx;
		}
		else
			value << (attribNdx != 0 ? " + " : "" ) << "a_attrib" << attribNdx;
	}

	vertexShaderStream
		<< "out mediump vec4 v_value;\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "\tv_value = " << value.str() << ";\n";

	if (state.attributes[0].integer)
	{
		float scale = 0.0f;

		switch (state.attributes[0].type)
		{
			case GL_SHORT:			scale  = (1.0f/float((1u<<14)-1u));	break;
			case GL_UNSIGNED_SHORT:	scale  = (1.0f/float((1u<<15)-1u));	break;
			case GL_INT:			scale  = (1.0f/float((1u<<30)-1u));	break;
			case GL_UNSIGNED_INT:	scale  = (1.0f/float((1u<<31)-1u));	break;
			case GL_BYTE:			scale  = (1.0f/float((1u<<6)-1u));	break;
			case GL_UNSIGNED_BYTE:	scale  = (1.0f/float((1u<<7)-1u));	break;


			default:
				DE_ASSERT(DE_FALSE);
		}

		vertexShaderStream
			<< "\tgl_Position = vec4(" << scale << " * " <<  "a_attrib0.xyz, 1.0);\n"
			<< "}";
	}
	else
	{
		if (state.attributes[0].normalized || state.attributes[0].type == GL_FLOAT)
		{
			vertexShaderStream
				<< "\tgl_Position = vec4(a_attrib0.xyz, 1.0);\n"
				<< "}";
		}
		else
		{
			float scale = 0.0f;

			switch (state.attributes[0].type)
			{
				case GL_SHORT:			scale  = (1.0f/float((1u<<14)-1u));	break;
				case GL_UNSIGNED_SHORT:	scale  = (1.0f/float((1u<<15)-1u));	break;
				case GL_INT:			scale  = (1.0f/float((1u<<30)-1u));	break;
				case GL_UNSIGNED_INT:	scale  = (1.0f/float((1u<<31)-1u));	break;
				case GL_BYTE:			scale  = (1.0f/float((1u<<6)-1u));	break;
				case GL_UNSIGNED_BYTE:	scale  = (1.0f/float((1u<<7)-1u));	break;

				default:
					DE_ASSERT(DE_FALSE);
			}

			scale *= 0.5f;

			vertexShaderStream
				<< "\tgl_Position = vec4(" << scale << " * " <<  "vec3(a_attrib0.xyz), 1.0);\n"
				<< "}";
		}
	}

	const char* fragmentShader =
	"#version 300 es\n"
	"in mediump vec4 v_value;\n"
	"layout(location = 0) out mediump vec4 fragColor;\n"
	"void main (void)\n"
	"{\n"
	"\tfragColor = vec4(v_value.xyz, 1.0);\n"
	"}";

	return new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(vertexShaderStream.str(), fragmentShader));
}